

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid::IfcRevolvedAreaSolid(IfcRevolvedAreaSolid *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcRevolvedAreaSolid";
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__00764248);
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x58 = 0;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x60 = 0;
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x764168;
  *(undefined8 *)&this->field_0x70 = 0x764230;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x764190;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7641b8;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0x7641e0;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0x764208;
  return;
}

Assistant:

IfcRevolvedAreaSolid() : Object("IfcRevolvedAreaSolid") {}